

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskImageImplementation.hpp
# Opt level: O0

void __thiscall
Storage::Disk::DiskImageHolder<Storage::Disk::WOZ>::~DiskImageHolder
          (DiskImageHolder<Storage::Disk::WOZ> *this)

{
  bool bVar1;
  pointer this_00;
  DiskImageHolder<Storage::Disk::WOZ> *this_local;
  
  (this->super_DiskImageHolderBase).super_Disk._vptr_Disk =
       (_func_int **)&PTR__DiskImageHolder_00c96a18;
  (this->super_TypeDistinguisher)._vptr_TypeDistinguisher = (_func_int **)&DAT_00c96a78;
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr *)&(this->super_DiskImageHolderBase).update_queue_);
  if (bVar1) {
    this_00 = std::
              unique_ptr<Concurrency::AsyncTaskQueue<true,_true,_void>,_std::default_delete<Concurrency::AsyncTaskQueue<true,_true,_void>_>_>
              ::operator->(&(this->super_DiskImageHolderBase).update_queue_);
    Concurrency::AsyncTaskQueue<true,_true,_void>::flush(this_00);
  }
  WOZ::~WOZ(&this->disk_image_);
  DiskImageHolderBase::~DiskImageHolderBase(&this->super_DiskImageHolderBase);
  return;
}

Assistant:

DiskImageHolder<T>::~DiskImageHolder() {
	if(update_queue_) update_queue_->flush();
}